

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O3

int32_t __thiscall cppnet::BufferBlock::MoveWritePt(BufferBlock *this,int32_t len)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  pcVar2 = this->_buffer_start;
  if (pcVar2 == (char *)0x0) {
    return 0;
  }
  if (len < 1) {
    uVar6 = -len;
    pcVar1 = this->_read;
    pcVar3 = this->_write;
    if (pcVar1 < pcVar3) {
      uVar7 = (int)pcVar3 - (int)pcVar1;
      if (uVar7 == uVar6 || SBORROW4(uVar7,uVar6) != (int)(uVar7 + len) < 0) {
LAB_001162e6:
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[4])();
        return uVar7;
      }
      pcVar3 = pcVar3 + -(ulong)uVar6;
    }
    else {
      if ((pcVar1 == pcVar3) && (this->_can_read == false)) {
        return 0;
      }
      uVar5 = (long)pcVar3 - (long)pcVar2;
      pcVar2 = this->_buffer_end;
      iVar4 = (int)uVar5;
      uVar7 = (int)pcVar2 + (iVar4 - (int)pcVar1);
      if (uVar7 == uVar6 || SBORROW4(uVar7,uVar6) != (int)(uVar7 + len) < 0) goto LAB_001162e6;
      uVar8 = (ulong)uVar6;
      if (-iVar4 != len && iVar4 <= (int)uVar6) goto LAB_001162da;
      pcVar3 = pcVar3 + -uVar8;
    }
LAB_001162f1:
    this->_write = pcVar3;
  }
  else {
    pcVar1 = this->_read;
    pcVar3 = this->_write;
    if (pcVar3 < pcVar1) {
      uVar6 = (int)pcVar1 - (int)pcVar3;
      if (len < (int)uVar6) {
        pcVar3 = pcVar3 + (uint)len;
        uVar6 = len;
        goto LAB_001162f1;
      }
    }
    else {
      if ((pcVar3 == pcVar1) && (this->_can_read != false)) {
        return 0;
      }
      uVar8 = (long)this->_buffer_end - (long)pcVar3;
      uVar6 = (int)uVar8 + ((int)pcVar1 - (int)pcVar2);
      if (len < (int)uVar6) {
        uVar5 = (ulong)(uint)len;
        uVar6 = len;
        if ((int)uVar8 < len) {
LAB_001162da:
          this->_write = pcVar2 + (uVar5 - uVar8);
          return uVar6;
        }
        pcVar3 = pcVar3 + uVar5;
        goto LAB_001162f1;
      }
    }
    this->_write = pcVar1;
    this->_can_read = true;
  }
  return uVar6;
}

Assistant:

int32_t BufferBlock::MoveWritePt(int32_t len) {
    if (!_buffer_start) {
        return 0;
    }

    if (len > 0) {
        /*s-----------w-----r-------------e*/
        if (_write < _read) {
            size_t size = _read - _write;
            // all buffer will be used
            if ((int32_t)size <= len) {
                _write = _read;
                _can_read = true;
                return (int32_t)size;

            // part of buffer will be used
            } else {
                _write += len;
                return len;
            }

        /*s-----------r-----w-------------e*/
        /*s-----------rw------------------e*/
        } else {
            if(_can_read && _read == _write) {
                return 0;
            }
            size_t size_start = _read - _buffer_start;
            size_t size_end = _buffer_end - _write;
            size_t size =  size_start + size_end;

            // all buffer will be used
            if ((int32_t)size <= len) {
                _write = _read;
                _can_read = true;
                return (int32_t)size;

            // part of buffer will be used
            } else {
                if (len <= (int32_t)size_end) {
                    _write += len;
                    return len;

                } else {
                    size_t left = len - size_end;
                    _write = _buffer_start + left;
                    return len;
                }
            }
        }

    } else {
        len = -len;
        /*s-----------r-----w-------------e*/
        if (_read < _write) {
            size_t size = _write - _read;
            // rewrite all buffer
            if ((int32_t)size <= len) {
                Clear();
                return (int32_t)size;

            // only rewrite part of buffer
            } else {
                _write -= len;
                return len;
            }
        
        /*s-----------w-----r-------------e*/
        /*s-----------wr------------------e*/
        } else {
            if(!_can_read && _read == _write) {
                return 0;
            }
            size_t size_start = _write - _buffer_start;
            size_t size_end = _buffer_end - _read;
            size_t size =  size_start + size_end;
            // rewrite all buffer
            if ((int32_t)size <= len) {
                Clear();
                return (int32_t)size;

            // only rewrite part of buffer
            } else {
                if (len <= (int32_t)size_start) {
                    _write -= len;
                    return len;

                } else {
                    size_t left = len - size_start;
                    _write = _buffer_end - left;
                    return len;
                }
            }
        }
    }
}